

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UICamera.cpp
# Opt level: O3

void UI::CameraMenuItems(shared_ptr<Camera> *camera)

{
  bool bVar1;
  
  bVar1 = ImGui::BeginMenu("Camera",true);
  if (bVar1) {
    ImGui::DragAngle("FOV",&((camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                            )->m_fov,1.0,10.0,179.0,"%.1f deg",0x10);
    ImGui::InputFloat3("Position",
                       (float *)(camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr,"%.3f",0);
    ImGui::DragAngle("Yaw",&((camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                            )->m_yaw,1.0,0.0,360.0,"%.1f deg",0x10);
    ImGui::DragAngle("Pitch",&((camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->m_pitch,1.0,-90.0,90.0,"%.1f deg",0x10);
    ImGui::Separator();
    ImGui::DragFloat("Speed",&((camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->m_speed,0.005,0.005,0.2,"%.3f",0);
    ImGui::DragFloat("Sensitivity",
                     &((camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      m_sensitivity,0.001,0.001,0.02,"%.3f",0);
    ImGui::EndMenu();
    return;
  }
  return;
}

Assistant:

void CameraMenuItems(const std::shared_ptr<Camera> &camera) {
	if (ImGui::BeginMenu("Camera")) {
		ImGui::DragAngle("FOV", &camera->m_fov, 1, 10, 179);
		ImGui::InputFloat3("Position", &camera->m_position[0]);
		ImGui::DragAngle("Yaw", &camera->m_yaw, 1, 0, 360);
		ImGui::DragAngle("Pitch", &camera->m_pitch, 1, -90, 90);
		ImGui::Separator();
		ImGui::DragFloat("Speed", &camera->m_speed, 0.005f, 0.005f, 0.2f);
		ImGui::DragFloat("Sensitivity", &camera->m_sensitivity, 0.001f, 0.001f, 0.02f);
		ImGui::EndMenu();
	}
}